

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

bool __thiscall
gl3cts::ClipDistance::NegativeTest::testClipVertexBuildingErrors(NegativeTest *this,Functions *gl)

{
  ostringstream *this_00;
  bool bVar1;
  ContextType ctxType;
  bool bVar2;
  Program program;
  allocator<char> local_25a;
  allocator<char> local_259;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  string local_238;
  Program local_218;
  undefined1 local_198 [384];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x113);
  bVar2 = true;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,m_vertex_shader_code_case_0,&local_259);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,m_fragment_shader_code,&local_25a);
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Utility::Program::Program(&local_218,gl,(string *)local_198,&local_238,&local_258);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)local_198);
    bVar2 = local_218.m_program_status.program_id == 0;
    if (!bVar2) {
      local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_198 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "Functional test have failed. Building shader which statically writes to both gl_ClipVertex and gl_ClipDistances[] has unexpectedly succeeded."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    Utility::Program::~Program(&local_218);
  }
  return bVar2;
}

Assistant:

bool gl3cts::ClipDistance::NegativeTest::testClipVertexBuildingErrors(const glw::Functions& gl)
{
	/* If OpenGL version < 3.1 is available, check that building shader program
	 fails when vertex shader statically writes to both gl_ClipVertex and
	 gl_ClipDistance[0]. Validate that the vertex shader which statically
	 writes to only the gl_ClipVertex or to the gl_ClipDistance[0] builds
	 without fail. */

	/* This test should only be executed if we're running a GL3.0 or less context */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType(3, 1, glu::PROFILE_CORE)))
	{
		return true;
	}

	gl3cts::ClipDistance::Utility::Program program(gl, m_vertex_shader_code_case_0, m_fragment_shader_code);

	if (program.ProgramStatus().program_id)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Functional test have failed. "
													   "Building shader which statically writes to both gl_ClipVertex "
													   "and gl_ClipDistances[] has unexpectedly succeeded."
						   << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}